

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parasail_sequences_free(parasail_sequences_t *sequences)

{
  ulong local_18;
  size_t i;
  parasail_sequences_t *sequences_local;
  
  for (local_18 = 0; local_18 < sequences->l; local_18 = local_18 + 1) {
    if (sequences->seqs[local_18].name.s != (char *)0x0) {
      free(sequences->seqs[local_18].name.s);
    }
    if (sequences->seqs[local_18].comment.s != (char *)0x0) {
      free(sequences->seqs[local_18].comment.s);
    }
    if (sequences->seqs[local_18].seq.s != (char *)0x0) {
      free(sequences->seqs[local_18].seq.s);
    }
    if (sequences->seqs[local_18].qual.s != (char *)0x0) {
      free(sequences->seqs[local_18].qual.s);
    }
  }
  free(sequences->seqs);
  free(sequences);
  return;
}

Assistant:

void parasail_sequences_free(parasail_sequences_t *sequences)
{
    size_t i;
    for (i=0; i<sequences->l; ++i) {
        if (sequences->seqs[i].name.s)    free(sequences->seqs[i].name.s);
        if (sequences->seqs[i].comment.s) free(sequences->seqs[i].comment.s);
        if (sequences->seqs[i].seq.s)     free(sequences->seqs[i].seq.s);
        if (sequences->seqs[i].qual.s)    free(sequences->seqs[i].qual.s);
    }
    free(sequences->seqs);
    free(sequences);
}